

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

void http_handle_file(nng_http *conn,void *arg,nni_aio *aio)

{
  char *pcVar1;
  int iVar2;
  nng_err result;
  char *val;
  nng_http_status status;
  void *local_30;
  void *data;
  size_t size;
  
  pcVar1 = *(char **)((long)arg + 0x10);
  iVar2 = nni_file_get(*(char **)((long)arg + 8),&local_30,(size_t *)&data);
  if (iVar2 == 0) {
    val = "application/octet-stream";
    if (pcVar1 != (char *)0x0) {
      val = pcVar1;
    }
    result = nni_http_set_header(conn,"Content-Type",val);
    if ((result == NNG_OK) &&
       (result = nni_http_copy_body(conn,local_30,(size_t)data), result == NNG_OK)) {
      nng_http_set_status(conn,NNG_HTTP_STATUS_OK,(char *)0x0);
      nni_free(local_30,(size_t)data);
      goto LAB_00138f26;
    }
    nni_free(local_30,(size_t)data);
  }
  else {
    if (iVar2 == 0x10) {
      status = NNG_HTTP_STATUS_FORBIDDEN;
    }
    else {
      status = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
      if (iVar2 == 0xc) {
        status = NNG_HTTP_STATUS_NOT_FOUND;
      }
    }
    result = nni_http_set_error(conn,status,(char *)0x0,(char *)0x0);
    if (result == NNG_OK) {
LAB_00138f26:
      nni_aio_finish(aio,NNG_OK,0);
      return;
    }
  }
  nni_aio_finish_error(aio,result);
  return;
}

Assistant:

static void
http_handle_file(nng_http *conn, void *arg, nni_aio *aio)
{
	void       *data;
	size_t      size;
	int         rv;
	http_file  *hf = arg;
	const char *ctype;

	if ((ctype = hf->ctype) == NULL) {
		ctype = "application/octet-stream";
	}

	// This is a very simplistic file server, suitable only for small
	// files.  In the future we can use an AIO based file read, where
	// we read files a bit at a time, or even mmap them, and serve
	// them up chunkwise.  Applications could even come up with their own
	// caching version of the http handler.
	if ((rv = nni_file_get(hf->path, &data, &size)) != 0) {
		nng_http_status status;
		switch (rv) {
		case NNG_ENOMEM:
			status = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
			break;
		case NNG_ENOENT:
			status = NNG_HTTP_STATUS_NOT_FOUND;
			break;
		case NNG_EPERM:
			status = NNG_HTTP_STATUS_FORBIDDEN;
			break;
		default:
			status = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
			break;
		}
		if ((rv = nni_http_set_error(conn, status, NULL, NULL)) != 0) {
			nni_aio_finish_error(aio, rv);
			return;
		}
		nni_aio_finish(aio, NNG_OK, 0);
		return;
	}
	if (((rv = nni_http_set_header(conn, "Content-Type", ctype)) != 0) ||
	    ((rv = nni_http_copy_body(conn, data, size)) != 0)) {
		nni_free(data, size);
		nni_aio_finish_error(aio, rv);
		return;
	}

	nng_http_set_status(conn, NNG_HTTP_STATUS_OK, NULL);

	nni_free(data, size);
	nni_aio_finish(aio, NNG_OK, 0);
}